

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_serialize.c
# Opt level: O3

MSize lj_serialize_peektype(SBufExt *sbx)

{
  byte bVar1;
  byte *pbVar2;
  char *pcVar3;
  MSize MVar4;
  uint32_t tp;
  
  pbVar2 = (byte *)sbx->r;
  MVar4 = 0;
  if (pbVar2 < sbx->w) {
    bVar1 = *pbVar2;
    tp = (uint32_t)bVar1;
    if ((bVar1 < 0xe0) ||
       (tp = (uint)bVar1, pcVar3 = serialize_ru124_((char *)(pbVar2 + 1),sbx->w,&tp), MVar4 = 0,
       pcVar3 != (char *)0x0)) {
      if (tp < 0x13) {
        MVar4 = *(MSize *)(&DAT_00161b2c + (ulong)tp * 4);
      }
      else {
        MVar4 = 4;
      }
    }
  }
  return MVar4;
}

Assistant:

LJ_FASTCALL lj_serialize_peektype(SBufExt *sbx)
{
  uint32_t tp;
  if (serialize_ru124(sbx->r, sbx->w, &tp)) {
    /* This must match the handling of all tags in the decoder above. */
    switch (tp) {
    case SER_TAG_NIL: return IRT_NIL;
    case SER_TAG_FALSE: return IRT_FALSE;
    case SER_TAG_TRUE: return IRT_TRUE;
    case SER_TAG_NULL: case SER_TAG_LIGHTUD32: case SER_TAG_LIGHTUD64:
      return IRT_LIGHTUD;
    case SER_TAG_INT: return LJ_DUALNUM ? IRT_INT : IRT_NUM;
    case SER_TAG_NUM: return IRT_NUM;
    case SER_TAG_TAB: case SER_TAG_TAB+1: case SER_TAG_TAB+2:
    case SER_TAG_TAB+3: case SER_TAG_TAB+4: case SER_TAG_TAB+5:
    case SER_TAG_DICT_MT:
      return IRT_TAB;
    case SER_TAG_INT64: case SER_TAG_UINT64: case SER_TAG_COMPLEX:
      return IRT_CDATA;
    case SER_TAG_DICT_STR:
    default:
      return IRT_STR;
    }
  }
  return IRT_NIL;  /* Will fail on actual decode. */
}